

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

natwm_error client_handle_drag(natwm_state *state,client *client,int16_t x,int16_t y)

{
  undefined8 in_R8;
  undefined8 in_R9;
  int local_28;
  int local_24;
  uint32_t values [2];
  uint16_t mask;
  int16_t y_local;
  int16_t x_local;
  client *client_local;
  natwm_state *state_local;
  
  (client->rect).x = (client->rect).x + x;
  (client->rect).y = (client->rect).y + y;
  values[0]._2_2_ = 3;
  local_28 = (int)(client->rect).x + (int)state->button_state->monitor_rect->x;
  local_24 = (int)(client->rect).y + (int)state->button_state->monitor_rect->y;
  values[1]._0_2_ = y;
  values[1]._2_2_ = x;
  xcb_configure_window(state->xcb,client->window,3,&local_28,in_R8,in_R9,0x1076e3);
  return NO_ERROR;
}

Assistant:

enum natwm_error client_handle_drag(const struct natwm_state *state, struct client *client,
                                    int16_t x, int16_t y)
{
        client->rect.x = (int16_t)(client->rect.x + x);
        client->rect.y = (int16_t)(client->rect.y + y);

        uint16_t mask = XCB_CONFIG_WINDOW_X | XCB_CONFIG_WINDOW_Y;
        uint32_t values[] = {
                (uint32_t)(client->rect.x + state->button_state->monitor_rect->x),
                (uint32_t)(client->rect.y + state->button_state->monitor_rect->y),
        };

        xcb_configure_window(state->xcb, client->window, mask, values);

        return NO_ERROR;
}